

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O0

void compute_least_squares_endpoints_rgb
               (uint32_t N,uint8_t *pSelectors,vec4F *pSelector_weights,vec4F *pXl,vec4F *pXh,
               color_quad_u8 *pColors)

{
  uint uVar1;
  float *in_RCX;
  long in_RDX;
  long in_RSI;
  uint in_EDI;
  float *in_R8;
  long in_R9;
  float fVar2;
  float fVar3;
  uint32_t i_1;
  uint32_t hi_v;
  uint32_t lo_v;
  uint32_t c;
  float iz11;
  float iz10;
  float iz01;
  float iz00;
  float det;
  float w;
  uint32_t sel;
  uint32_t i;
  float t_b;
  float q10_b;
  float q00_b;
  float t_g;
  float q10_g;
  float q00_g;
  float t_r;
  float q10_r;
  float q00_r;
  float z11;
  float z10;
  float z01;
  float z00;
  uint local_94;
  uint32_t local_90;
  uint32_t local_8c;
  uint local_88;
  float local_74;
  uint local_68;
  float local_64;
  float local_5c;
  float local_58;
  float local_50;
  float local_4c;
  float local_44;
  float local_40;
  float local_3c;
  float local_34;
  
  local_34 = 0.0;
  local_3c = 0.0;
  local_40 = 0.0;
  local_44 = 0.0;
  local_4c = 0.0;
  local_50 = 0.0;
  local_58 = 0.0;
  local_5c = 0.0;
  local_64 = 0.0;
  for (local_68 = 0; local_68 < in_EDI; local_68 = local_68 + 1) {
    uVar1 = (uint)*(byte *)(in_RSI + (ulong)local_68);
    local_34 = *(float *)(in_RDX + (ulong)uVar1 * 0x10) + local_34;
    local_3c = *(float *)(in_RDX + (ulong)uVar1 * 0x10 + 4) + local_3c;
    local_40 = *(float *)(in_RDX + (ulong)uVar1 * 0x10 + 8) + local_40;
    fVar2 = *(float *)(in_RDX + (ulong)uVar1 * 0x10 + 0xc);
    local_44 = fVar2 * (float)*(byte *)(in_R9 + (ulong)local_68 * 4) + local_44;
    local_4c = (float)*(byte *)(in_R9 + (ulong)local_68 * 4) + local_4c;
    local_50 = fVar2 * (float)*(byte *)(in_R9 + 1 + (ulong)local_68 * 4) + local_50;
    local_58 = (float)*(byte *)(in_R9 + 1 + (ulong)local_68 * 4) + local_58;
    local_5c = fVar2 * (float)*(byte *)(in_R9 + 2 + (ulong)local_68 * 4) + local_5c;
    local_64 = (float)*(byte *)(in_R9 + 2 + (ulong)local_68 * 4) + local_64;
  }
  local_74 = local_34 * local_40 + -(local_3c * local_3c);
  if ((local_74 != 0.0) || (NAN(local_74))) {
    local_74 = 1.0 / local_74;
  }
  local_40 = local_40 * local_74;
  fVar2 = -local_3c * local_74;
  fVar3 = -local_3c * local_74;
  local_34 = local_34 * local_74;
  *in_RCX = local_40 * local_44 + fVar2 * (local_4c - local_44);
  *in_R8 = fVar3 * local_44 + local_34 * (local_4c - local_44);
  in_RCX[1] = local_40 * local_50 + fVar2 * (local_58 - local_50);
  in_R8[1] = fVar3 * local_50 + local_34 * (local_58 - local_50);
  in_RCX[2] = local_40 * local_5c + fVar2 * (local_64 - local_5c);
  in_R8[2] = fVar3 * local_5c + local_34 * (local_64 - local_5c);
  in_RCX[3] = 255.0;
  in_R8[3] = 255.0;
  for (local_88 = 0; local_88 < 3; local_88 = local_88 + 1) {
    if ((in_RCX[local_88] <= 0.0 && in_RCX[local_88] != 0.0) || (255.0 < in_R8[local_88])) {
      local_8c = 0xffffffff;
      local_90 = 0;
      for (local_94 = 0; local_94 < in_EDI; local_94 = local_94 + 1) {
        local_8c = minimumu(local_8c,(uint)*(byte *)(in_R9 + (ulong)local_94 * 4 + (ulong)local_88))
        ;
        local_90 = maximumu(local_90,(uint)*(byte *)(in_R9 + (ulong)local_94 * 4 + (ulong)local_88))
        ;
      }
      if (local_8c == local_90) {
        in_RCX[local_88] = (float)local_8c;
        in_R8[local_88] = (float)local_90;
      }
    }
  }
  return;
}

Assistant:

static void compute_least_squares_endpoints_rgb(uint32_t N, const uint8_t *pSelectors, const vec4F *pSelector_weights, vec4F *pXl, vec4F *pXh, const color_quad_u8 *pColors)
{
	float z00 = 0.0f, z01 = 0.0f, z10 = 0.0f, z11 = 0.0f;
	float q00_r = 0.0f, q10_r = 0.0f, t_r = 0.0f;
	float q00_g = 0.0f, q10_g = 0.0f, t_g = 0.0f;
	float q00_b = 0.0f, q10_b = 0.0f, t_b = 0.0f;
	for (uint32_t i = 0; i < N; i++)
	{
		const uint32_t sel = pSelectors[i];
		z00 += pSelector_weights[sel].m_c[0];
		z10 += pSelector_weights[sel].m_c[1];
		z11 += pSelector_weights[sel].m_c[2];
		float w = pSelector_weights[sel].m_c[3];
		q00_r += w * pColors[i].m_c[0]; t_r += pColors[i].m_c[0];
		q00_g += w * pColors[i].m_c[1]; t_g += pColors[i].m_c[1];
		q00_b += w * pColors[i].m_c[2]; t_b += pColors[i].m_c[2];
	}

	q10_r = t_r - q00_r;
	q10_g = t_g - q00_g;
	q10_b = t_b - q00_b;

	z01 = z10;

	float det = z00 * z11 - z01 * z10;
	if (det != 0.0f)
		det = 1.0f / det;

	float iz00, iz01, iz10, iz11;
	iz00 = z11 * det;
	iz01 = -z01 * det;
	iz10 = -z10 * det;
	iz11 = z00 * det;

	pXl->m_c[0] = (float)(iz00 * q00_r + iz01 * q10_r); pXh->m_c[0] = (float)(iz10 * q00_r + iz11 * q10_r);
	pXl->m_c[1] = (float)(iz00 * q00_g + iz01 * q10_g); pXh->m_c[1] = (float)(iz10 * q00_g + iz11 * q10_g);
	pXl->m_c[2] = (float)(iz00 * q00_b + iz01 * q10_b); pXh->m_c[2] = (float)(iz10 * q00_b + iz11 * q10_b);
	pXl->m_c[3] = 255.0f; pXh->m_c[3] = 255.0f;

	for (uint32_t c = 0; c < 3; c++)
	{
		if ((pXl->m_c[c] < 0.0f) || (pXh->m_c[c] > 255.0f))
		{
			uint32_t lo_v = UINT32_MAX, hi_v = 0;
			for (uint32_t i = 0; i < N; i++)
			{
				lo_v = minimumu(lo_v, pColors[i].m_c[c]);
				hi_v = maximumu(hi_v, pColors[i].m_c[c]);
			}

			if (lo_v == hi_v)
			{
				pXl->m_c[c] = (float)lo_v;
				pXh->m_c[c] = (float)hi_v;
			}
		}
	}
}